

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall
Rml::BaseXMLParser::ReadAttributes
          (BaseXMLParser *this,XMLAttributes *attributes,bool *parse_raw_xml_content)

{
  bool bVar1;
  const_iterator cVar2;
  type this_00;
  byte unaff_R14B;
  String value;
  String attribute;
  String local_a8;
  String local_88;
  bool *local_68;
  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
  *local_60;
  flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  *local_58;
  String local_50;
  
  local_58 = (flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->attributes_for_inner_xml_data;
  local_68 = parse_raw_xml_content;
  local_60 = (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              *)attributes;
  do {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    bVar1 = FindWord(this,&local_88,"=/>");
    if (bVar1) {
      bVar1 = PeekString(this,"=",true);
      if (bVar1) {
        bVar1 = PeekString(this,"\"",true);
        if (bVar1) {
          bVar1 = FindString(this,"\"",&local_a8,false);
        }
        else {
          bVar1 = PeekString(this,"\'",true);
          if (bVar1) {
            bVar1 = FindString(this,"\'",&local_a8,false);
          }
          else {
            bVar1 = FindWord(this,&local_a8,"/>");
          }
        }
        if (bVar1 == false) goto LAB_001e3c66;
      }
      cVar2 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::find<std::__cxx11::string>(local_58,&local_88);
      if (cVar2._M_current !=
          (this->attributes_for_inner_xml_data).m_container.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        *local_68 = true;
      }
      StringUtilities::DecodeRml(&local_50,&local_a8);
      this_00 = itlib::
                flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                ::operator[]<std::__cxx11::string&>(local_60,&local_88);
      Variant::Clear(this_00);
      Variant::Set(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = PeekString(this,"/",false);
      if (bVar1) {
        unaff_R14B = 1;
        goto LAB_001e3c69;
      }
      bVar1 = PeekString(this,">",false);
      unaff_R14B = unaff_R14B | bVar1;
      bVar1 = !bVar1;
    }
    else {
LAB_001e3c66:
      unaff_R14B = 0;
LAB_001e3c69:
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar1) {
      return (bool)(unaff_R14B & 1);
    }
  } while( true );
}

Assistant:

bool BaseXMLParser::ReadAttributes(XMLAttributes& attributes, bool& parse_raw_xml_content)
{
	for (;;)
	{
		String attribute;
		String value;

		// Get the attribute name
		if (!FindWord(attribute, "=/>"))
		{
			return false;
		}

		// Check if theres an assigned value
		if (PeekString("="))
		{
			if (PeekString("\""))
			{
				if (!FindString("\"", value))
					return false;
			}
			else if (PeekString("'"))
			{
				if (!FindString("'", value))
					return false;
			}
			else if (!FindWord(value, "/>"))
			{
				return false;
			}
		}

		if (attributes_for_inner_xml_data.count(attribute) == 1)
			parse_raw_xml_content = true;

		attributes[attribute] = StringUtilities::DecodeRml(value);

		// Check for the end of the tag.
		if (PeekString("/", false) || PeekString(">", false))
			return true;
	}
}